

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void __thiscall
network::Network::receiver
          (Network *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback)

{
  io_service service;
  endpoint sender_ep;
  socket sock;
  char buf [1024];
  data_union *local_4e8;
  undefined8 local_4e0;
  io_context local_4d8;
  data_union local_4c4;
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  data_union local_438 [36];
  
  boost::asio::io_context::io_context(&local_4d8);
  local_438[0].v6.sin6_scope_id = 0;
  local_438[0]._8_1_ = '\0';
  local_438[0]._9_1_ = '\0';
  local_438[0]._10_1_ = '\0';
  local_438[0]._11_1_ = '\0';
  local_438[0]._12_1_ = '\0';
  local_438[0]._13_1_ = '\0';
  local_438[0]._14_1_ = '\0';
  local_438[0]._15_1_ = '\0';
  local_438[0]._16_8_ = 0;
  local_438[0]._2_2_ = this->port_ << 8 | this->port_ >> 8;
  local_438[0].base.sa_family = 2;
  local_438[0].v6.sin6_flowinfo = 0;
  boost::asio::
  basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket<boost::asio::io_context>
            ((basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&local_4a8,&local_4d8,(endpoint_type *)&local_438[0].base,(type *)0x0);
  while( true ) {
    local_4c4.base.sa_data[6] = '\0';
    local_4c4.base.sa_data[7] = '\0';
    local_4c4.base.sa_data[8] = '\0';
    local_4c4.base.sa_data[9] = '\0';
    local_4c4.base.sa_data[10] = '\0';
    local_4c4.base.sa_data[0xb] = '\0';
    local_4c4.base.sa_data[0xc] = '\0';
    local_4c4.base.sa_data[0xd] = '\0';
    local_4c4._16_8_ = 0;
    local_4c4.v6.sin6_scope_id = 0;
    local_4c4._0_8_ = 2;
    memset(local_438,0,0x400);
    local_4e0 = 0x400;
    local_4e8 = local_438;
    boost::asio::
    basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::receive_from<boost::asio::mutable_buffers_1>
              ((basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)&local_4a8,(mutable_buffers_1 *)&local_4e8,(endpoint_type *)&local_4c4.base);
    if (this->isReceiverRun == false) break;
    std::__cxx11::string::string((string *)&local_458,(char *)local_438,(allocator *)&local_4e8);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(callback,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_4a8);
  boost::asio::execution_context::~execution_context(&local_4d8.super_execution_context);
  return;
}

Assistant:

void Network::receiver(const std::function<void(std::string)> callback)
{
	boost::asio::io_service service;
	udp::socket sock(service, udp::endpoint(udp::v4(), port_));
	char buf[PACKAGE_SIZE];
	while (true)
	{
		try
		{
			udp::endpoint sender_ep;
			memset(buf, 0, PACKAGE_SIZE);

			sock.receive_from(boost::asio::buffer(buf, PACKAGE_SIZE), sender_ep);

			if (!isReceiverRun)
				return;

			callback(buf);
		}
		catch (...)
		{
			continue;
		}
	}
}